

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imap.c
# Opt level: O2

char * imap_atom(char *str)

{
  bool bVar1;
  bool bVar2;
  bool bVar3;
  size_t sVar4;
  char *pcVar5;
  char *pcVar6;
  char cVar7;
  long lVar8;
  long lVar9;
  
  if (str == (char *)0x0) {
    return (char *)0x0;
  }
  lVar8 = 0;
  lVar9 = 0;
  bVar3 = false;
  pcVar5 = str;
  do {
    cVar7 = *pcVar5;
    if (cVar7 == ' ') {
      bVar3 = true;
    }
    else if (cVar7 == '\"') {
      lVar9 = lVar9 + 1;
    }
    else if (cVar7 == '\\') {
      lVar8 = lVar8 + 1;
    }
    else if (cVar7 == '\0') {
      bVar1 = lVar8 == 0;
      bVar2 = lVar9 == 0;
      if ((bVar1 && bVar2) && !bVar3) {
        pcVar5 = (*Curl_cstrdup)(str);
        return pcVar5;
      }
      sVar4 = strlen(str);
      lVar9 = lVar9 + lVar8 + (ulong)(byte)((bVar1 && bVar2) | bVar3) * 2;
      pcVar5 = (char *)(*Curl_cmalloc)(sVar4 + lVar9 + 1);
      if (pcVar5 == (char *)0x0) {
        return (char *)0x0;
      }
      lVar9 = lVar9 + sVar4;
      pcVar6 = pcVar5;
      if ((!bVar1 || !bVar2) && bVar3 == false) goto LAB_001232f6;
      *pcVar5 = '\"';
      pcVar5[lVar9 + -1] = '\"';
      do {
        pcVar6 = pcVar6 + 1;
LAB_001232f6:
        cVar7 = *str;
        if ((cVar7 == '\"') || (cVar7 == '\\')) {
          *pcVar6 = '\\';
          pcVar6 = pcVar6 + 1;
          cVar7 = *str;
        }
        else if (cVar7 == '\0') {
          pcVar5[lVar9] = '\0';
          return pcVar5;
        }
        *pcVar6 = cVar7;
        str = str + 1;
      } while( true );
    }
    pcVar5 = pcVar5 + 1;
  } while( true );
}

Assistant:

static char *imap_atom(const char *str)
{
  const char *p1;
  char *p2;
  size_t backsp_count = 0;
  size_t quote_count = 0;
  bool space_exists = FALSE;
  size_t newlen = 0;
  char *newstr = NULL;

  if(!str)
    return NULL;

  /* Count any unescaped characters */
  p1 = str;
  while(*p1) {
    if(*p1 == '\\')
      backsp_count++;
    else if(*p1 == '"')
      quote_count++;
    else if(*p1 == ' ')
      space_exists = TRUE;

    p1++;
  }

  /* Does the input contain any unescaped characters? */
  if(!backsp_count && !quote_count && !space_exists)
    return strdup(str);

  /* Calculate the new string length */
  newlen = strlen(str) + backsp_count + quote_count + (space_exists ? 2 : 0);

  /* Allocate the new string */
  newstr = (char *) malloc((newlen + 1) * sizeof(char));
  if(!newstr)
    return NULL;

  /* Surround the string in quotes if necessary */
  p2 = newstr;
  if(space_exists) {
    newstr[0] = '"';
    newstr[newlen - 1] = '"';
    p2++;
  }

  /* Copy the string, escaping backslash and quote characters along the way */
  p1 = str;
  while(*p1) {
    if(*p1 == '\\' || *p1 == '"') {
      *p2 = '\\';
      p2++;
    }

   *p2 = *p1;

    p1++;
    p2++;
  }

  /* Terminate the string */
  newstr[newlen] = '\0';

  return newstr;
}